

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O0

bool __thiscall QHttpSocketEngine::connectInternal(QHttpSocketEngine *this)

{
  quint16 qVar1;
  SocketState SVar2;
  QHttpSocketEnginePrivate *pQVar3;
  long lVar4;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QHttpSocketEngine *unaff_retaddr;
  QHttpSocketEnginePrivate *d;
  undefined4 in_stack_ffffffffffffff88;
  SocketState in_stack_ffffffffffffff8c;
  QAbstractSocketEngine *in_stack_ffffffffffffff90;
  QTcpSocket *this_00;
  undefined6 in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffff9e;
  bool local_45;
  undefined4 local_44;
  undefined1 local_40 [24];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QHttpSocketEngine *)0x33888a);
  pQVar3->credentialsSent = false;
  if (pQVar3->state == Connected) {
    QMessageLogger::QMessageLogger
              (in_RDI,(char *)CONCAT26(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98),
               (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    QMessageLogger::warning
              (local_28,"QHttpSocketEngine::connectToHost: called when already connected");
    QAbstractSocketEngine::setState(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    local_45 = true;
  }
  else {
    if ((pQVar3->state == ConnectSent) &&
       ((pQVar3->super_QAbstractSocketEnginePrivate).socketState != ConnectedState)) {
      QAbstractSocketEngine::setState(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    }
    if (pQVar3->state == None) {
      SVar2 = QAbstractSocket::state((QAbstractSocket *)0x338933);
      if (SVar2 == UnconnectedState) {
        QAbstractSocketEngine::setState(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        (**(code **)(*(long *)&pQVar3->socket->super_QAbstractSocket + 0x108))
                  (pQVar3->socket,0x10000);
        this_00 = pQVar3->socket;
        QNetworkProxy::hostName
                  ((QNetworkProxy *)CONCAT26(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98));
        qVar1 = QNetworkProxy::port((QNetworkProxy *)this_00);
        QFlags<QIODeviceBase::OpenModeFlag>::QFlags
                  ((QFlags<QIODeviceBase::OpenModeFlag> *)this_00,in_stack_ffffffffffffff8c);
        (**(code **)(*(long *)&this_00->super_QAbstractSocket + 0xf8))
                  (this_00,local_40,qVar1,local_44,2);
        QString::~QString((QString *)0x3389e0);
      }
    }
    lVar4 = (**(code **)(*(long *)&in_RDI->context + 0xb0))();
    if (lVar4 != 0) {
      slotSocketReadNotification(unaff_retaddr);
    }
    local_45 = (pQVar3->super_QAbstractSocketEnginePrivate).socketState == ConnectedState;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_45;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttpSocketEngine::connectInternal()
{
    Q_D(QHttpSocketEngine);

    d->credentialsSent = false;

    // If the handshake is done, enter ConnectedState state and return true.
    if (d->state == Connected) {
        qWarning("QHttpSocketEngine::connectToHost: called when already connected");
        setState(QAbstractSocket::ConnectedState);
        return true;
    }

    if (d->state == ConnectSent && d->socketState != QAbstractSocket::ConnectedState)
        setState(QAbstractSocket::UnconnectedState);

    // Handshake isn't done. If unconnected, start connecting.
    if (d->state == None && d->socket->state() == QAbstractSocket::UnconnectedState) {
        setState(QAbstractSocket::ConnectingState);
        //limit buffer in internal socket, data is buffered in the external socket under application control
        d->socket->setReadBufferSize(65536);
        d->socket->connectToHost(d->proxy.hostName(), d->proxy.port());
    }

    // If connected (might happen right away, at least for localhost services
    // on some BSD systems), there might already be bytes available.
    if (bytesAvailable())
        slotSocketReadNotification();

    return d->socketState == QAbstractSocket::ConnectedState;
}